

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmYield(LlvmCompilationContext *ctx,ExprYield *node)

{
  uint uVar1;
  uint uVar2;
  ExpressionContext *pEVar3;
  LLVMValueRef value;
  TypeBase *targetType;
  long lVar4;
  TypeBase *valueType;
  
  value = CompileLlvm(ctx,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  uVar1 = ctx->currentNextRestoreBlock;
  uVar2 = (ctx->currentRestoreBlocks).count;
  ctx->currentNextRestoreBlock = uVar1 + 1;
  if (uVar2 <= uVar1) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<LLVMBasicBlockRefOpaque *, 16>::operator[](unsigned int) [T = LLVMBasicBlockRefOpaque *, N = 16]"
                 );
  }
  targetType = node->value->type;
  pEVar3 = ctx->ctx;
  if (targetType == pEVar3->typeVoid) goto LAB_001805bc;
  lVar4 = 0x89d8;
  if (((pEVar3->typeBool == targetType) || (pEVar3->typeChar == targetType)) ||
     (pEVar3->typeShort == targetType)) {
LAB_001805a3:
    valueType = *(TypeBase **)((long)(pEVar3->uniqueDependencies).little + lVar4 + -0x30);
  }
  else {
    valueType = targetType;
    if (pEVar3->typeFloat == targetType) {
      lVar4 = 0x89f0;
      goto LAB_001805a3;
    }
  }
  ConvertToDataType(ctx,value,valueType,targetType);
  targetType = ctx->ctx->typeVoid;
LAB_001805bc:
  if ((node->super_ExprBase).type == targetType) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CompileLlvmYield(LlvmCompilationContext &ctx, ExprYield *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	if(node->coroutineStateUpdate)
		CompileLlvm(ctx, node->coroutineStateUpdate);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef block = ctx.currentRestoreBlocks[ctx.currentNextRestoreBlock++];

	if(node->value->type == ctx.ctx.typeVoid)
	{
		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		value = ConvertToDataType(ctx, value, GetStackType(ctx, node->value->type), node->value->type);

		if(IsStructReturnType(ctx.currentFunctionSource->type->returnType))
		{
			LLVMBuildStore(ctx.builder, value, LLVMGetParam(ctx.currentFunction, 0));

			LLVMBuildRetVoid(ctx.builder);
		}
		else
		{
			LLVMBuildRet(ctx.builder, value);
		}
	}

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	return CheckType(ctx, node, NULL);
}